

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O1

float __thiscall
lunasvg::LengthContext::viewportDimension(LengthContext *this,LengthDirection direction)

{
  undefined3 in_register_00000031;
  float fVar1;
  Size SVar2;
  
  SVar2 = SVGElement::currentViewportSize(this->m_element);
  fVar1 = SVar2.h;
  if (CONCAT31(in_register_00000031,direction) == 1) {
    SVar2.h = 0.0;
    SVar2.w = fVar1;
  }
  else if (CONCAT31(in_register_00000031,direction) != 0) {
    fVar1 = SVar2.w * SVar2.w + fVar1 * fVar1;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    SVar2.w = fVar1 / 1.4142135;
    SVar2.h = 0.0;
  }
  return SVar2.w;
}

Assistant:

float LengthContext::viewportDimension(LengthDirection direction) const
{
    auto viewportSize = m_element->currentViewportSize();
    switch(direction) {
    case LengthDirection::Horizontal:
        return viewportSize.w;
    case LengthDirection::Vertical:
        return viewportSize.h;
    default:
        return std::sqrt(viewportSize.w * viewportSize.w + viewportSize.h * viewportSize.h) / PLUTOVG_SQRT2;
    }
}